

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O0

void __thiscall
embree::RegressionTask::RegressionTask
          (RegressionTask *this,Test *test,uint sceneIndex,uint sceneCount,uint threadCount,
          bool cancelBuild)

{
  long *plVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  uint in_R8D;
  undefined1 in_R9B;
  uint hash;
  uint n;
  uint m;
  uint r2;
  uint r1;
  uint c2;
  uint c1;
  __integral_type in_stack_ffffffffffffff58;
  atomic<unsigned_long> *this_00;
  size_t in_stack_ffffffffffffff88;
  undefined3 in_stack_ffffffffffffff90;
  uint uVar2;
  
  uVar2 = CONCAT13(in_R9B,in_stack_ffffffffffffff90) & 0x1ffffff;
  *in_RDI = in_EDX;
  in_RDI[1] = in_ECX;
  *(undefined8 *)(in_RDI + 2) = in_RSI;
  plVar1 = (long *)(in_RDI + 6);
  *plVar1 = 0;
  if (*plVar1 != 0) {
    (**(code **)(*(long *)*plVar1 + 0x10))();
  }
  this_00 = (atomic<unsigned_long> *)(in_RDI + 8);
  BarrierSys::BarrierSys((BarrierSys *)CONCAT44(in_R8D,uVar2),in_stack_ffffffffffffff88);
  in_RDI[10] = 0;
  *(byte *)(in_RDI + 0xb) = (byte)(uVar2 >> 0x18) & 1;
  std::atomic<unsigned_long>::atomic(this_00,in_stack_ffffffffffffff58);
  BarrierSys::init((BarrierSys *)(in_RDI + 8),(EVP_PKEY_CTX *)(ulong)in_R8D);
  in_RDI[0xe] = 0xff19274a;
  return;
}

Assistant:

RegressionTask (VerifyApplication::Test* test, unsigned int sceneIndex, unsigned int sceneCount, unsigned int threadCount, bool cancelBuild)
      : sceneIndex(sceneIndex), sceneCount(sceneCount), test(test), scene(nullptr), numActiveThreads(0), cancelBuild(cancelBuild), errorCounter(0) 
    { 
      barrier.init(threadCount); 
      RandomSampler_init(sampler,0);
    }